

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  ParseInfoTree *this_00;
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  ParseInfoTree *pPVar4;
  undefined4 extraout_var;
  Message *pMVar5;
  AlphaNum *in_R8;
  string_view message_00;
  string delimiter;
  string_view local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  MessageFactory *factory;
  
  iVar3 = this->recursion_limit_;
  this->recursion_limit_ = iVar3 + -1;
  if (iVar3 < 1) {
    local_e0 = absl::lts_20250127::NullSafeStringView
                         (
                         "Message is too deep, the parser exceeded the configured recursion limit of "
                         );
    absl::lts_20250127::AlphaNum::AlphaNum(&local_60,this->initial_recursion_limit_);
    local_90.piece_ = absl::lts_20250127::NullSafeStringView(".");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&local_e0,&local_60,&local_90,in_R8);
    message_00._M_str = local_b0._M_dataplus._M_p;
    message_00._M_len = local_b0._M_string_length;
    ReportError(this,message_00);
    std::__cxx11::string::~string((string *)&local_b0);
    return false;
  }
  this_00 = this->parse_info_tree_;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar4 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar4;
  }
  local_e0._M_str = (char *)0x0;
  local_e0._M_len = (size_t)local_d0;
  local_d0[0]._M_local_buf[0] = '\0';
  bVar2 = ConsumeMessageDelimiter(this,(string *)&local_e0);
  if (bVar2) {
    pFVar1 = this->finder_;
    if (pFVar1 == (Finder *)0x0) {
      factory = (MessageFactory *)0x0;
    }
    else {
      iVar3 = (*pFVar1->_vptr_Finder[5])(pFVar1,field);
      factory = (MessageFactory *)CONCAT44(extraout_var,iVar3);
    }
    bVar2 = FieldDescriptor::is_repeated(field);
    if (bVar2) {
      pMVar5 = Reflection::AddMessage(reflection,message,field,factory);
      bVar2 = ConsumeMessage(this,pMVar5,(string *)&local_e0);
    }
    else {
      pMVar5 = Reflection::MutableMessage(reflection,message,field,factory);
      bVar2 = ConsumeMessage(this,pMVar5,(string *)&local_e0);
    }
    if (bVar2 != false) {
      this->recursion_limit_ = this->recursion_limit_ + 1;
      this->parse_info_tree_ = this_00;
      bVar2 = true;
      goto LAB_002231d9;
    }
  }
  bVar2 = false;
LAB_002231d9:
  std::__cxx11::string::~string((string *)&local_e0);
  return bVar2;
}

Assistant:

bool ConsumeFieldMessage(Message* message, const Reflection* reflection,
                           const FieldDescriptor* field) {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }
    // If the parse information tree is not nullptr, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != nullptr) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    MessageFactory* factory =
        finder_ ? finder_->FindExtensionFactory(field) : nullptr;
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field, factory),
                        delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field, factory),
                        delimiter));
    }

    ++recursion_limit_;

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }